

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_cbor.hpp
# Opt level: O1

type jsoncons::cbor::
     encode_cbor<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               cbor_encode_options *options)

{
  pointer puVar1;
  pointer __s;
  value_type_conflict *__val;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  cbor_stream_encoder encoder;
  allocator<char> local_151;
  binary_stream_sink local_150;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> local_118;
  
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150.stream_ptr_ = os;
  __s = (pointer)operator_new(0x4000);
  puVar1 = __s + 0x4000;
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __s;
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  memset(__s,0,0x4000);
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  local_150.begin_buffer_ = __s;
  local_150.end_buffer_ = puVar1;
  local_150.p_ = __s;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_cbor_encoder
            (&local_118,&local_150,options,&local_151);
  binary_stream_sink::~binary_stream_sink(&local_150);
  local_150.stream_ptr_ =
       (basic_ostream<char,_std::char_traits<char>_> *)&PTR__basic_json_visitor_00b5c770;
  local_150.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_118;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (j,(basic_json_visitor<char> *)&local_150);
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_cbor_encoder
            (&local_118);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_cbor(const T& j, 
                std::ostream& os, 
                const cbor_encode_options& options = cbor_encode_options())
    {
        using char_type = typename T::char_type;
        cbor_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }